

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2EndElementNs(void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI)

{
  xmlNodePtr elem;
  uint uVar1;
  xmlNodePtr cur;
  xmlParserNodeInfo node_info;
  xmlParserCtxtPtr ctxt;
  xmlChar *URI_local;
  xmlChar *prefix_local;
  xmlChar *localname_local;
  void *ctx_local;
  
  if (ctx != (void *)0x0) {
    elem = *(xmlNodePtr *)((long)ctx + 0x50);
    node_info.end_line = (unsigned_long)ctx;
    if ((*(int *)((long)ctx + 0x68) != 0) && (elem != (xmlNodePtr)0x0)) {
      node_info.begin_line =
           *(long *)(*(long *)((long)ctx + 0x38) + 0x20) -
           *(long *)(*(long *)((long)ctx + 0x38) + 0x18);
      node_info.end_pos = (unsigned_long)*(int *)(*(long *)((long)ctx + 0x38) + 0x34);
      cur = elem;
      xmlParserAddNodeInfo((xmlParserCtxtPtr)ctx,(xmlParserNodeInfoPtr)&cur);
    }
    *(undefined4 *)(node_info.end_line + 0x1a0) = 0xffffffff;
    if ((((*(int *)(node_info.end_line + 0x9c) != 0) && (*(int *)(node_info.end_line + 0x18) != 0))
        && (*(long *)(node_info.end_line + 0x10) != 0)) &&
       (*(long *)(*(long *)(node_info.end_line + 0x10) + 0x50) != 0)) {
      uVar1 = xmlValidateOneElement
                        ((xmlValidCtxtPtr)(node_info.end_line + 0xa0),
                         *(xmlDocPtr *)(node_info.end_line + 0x10),elem);
      *(uint *)(node_info.end_line + 0x98) = uVar1 & *(uint *)(node_info.end_line + 0x98);
    }
    nodePop((xmlParserCtxtPtr)node_info.end_line);
  }
  return;
}

Assistant:

void
xmlSAX2EndElementNs(void *ctx,
                    const xmlChar * localname ATTRIBUTE_UNUSED,
                    const xmlChar * prefix ATTRIBUTE_UNUSED,
		    const xmlChar * URI ATTRIBUTE_UNUSED)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlParserNodeInfo node_info;
    xmlNodePtr cur;

    if (ctx == NULL) return;
    cur = ctxt->node;
    /* Capture end position and add node */
    if ((ctxt->record_info) && (cur != NULL)) {
        node_info.end_pos = ctxt->input->cur - ctxt->input->base;
        node_info.end_line = ctxt->input->line;
        node_info.node = cur;
        xmlParserAddNodeInfo(ctxt, &node_info);
    }
    ctxt->nodemem = -1;

#ifdef LIBXML_VALID_ENABLED
    if (ctxt->validate && ctxt->wellFormed &&
        ctxt->myDoc && ctxt->myDoc->intSubset)
        ctxt->valid &= xmlValidateOneElement(&ctxt->vctxt, ctxt->myDoc, cur);
#endif /* LIBXML_VALID_ENABLED */

    /*
     * end of parsing of this node.
     */
    nodePop(ctxt);
}